

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O3

ALboolean alIsEnabled(ALenum capability)

{
  ALboolean AVar1;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alIsEnabled);
  writele32(capability);
  AVar1 = (*REAL_alIsEnabled)(capability);
  writele32((int)AVar1);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return AVar1;
}

Assistant:

ALboolean alIsEnabled(ALenum capability)
{
    ALboolean retval;
    IO_START(alIsEnabled);
    IO_ENUM(capability);
    retval = REAL_alIsEnabled(capability);
    IO_BOOLEAN(retval);
    IO_END();
    return retval;
}